

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void UncolorAtomicMergeSet(VmInstruction *inst)

{
  VmInstruction *pVVar1;
  uint uVar2;
  ulong uVar3;
  
  inst->color = 0;
  if ((inst->cmd == VM_INST_PHI) && ((inst->arguments).count != 0)) {
    uVar3 = 0;
    do {
      pVVar1 = (VmInstruction *)(inst->arguments).data[uVar3];
      if ((pVVar1 == (VmInstruction *)0x0) || ((pVVar1->super_VmValue).typeID != 2)) {
        pVVar1 = (VmInstruction *)0x0;
      }
      if (pVVar1->color != 0) {
        UncolorAtomicMergeSet(pVVar1);
      }
      uVar2 = (int)uVar3 + 2;
      uVar3 = (ulong)uVar2;
    } while (uVar2 < (inst->arguments).count);
  }
  if ((inst->super_VmValue).users.count != 0) {
    uVar3 = 0;
    do {
      pVVar1 = (VmInstruction *)(inst->super_VmValue).users.data[uVar3];
      if ((pVVar1 == (VmInstruction *)0x0) || ((pVVar1->super_VmValue).typeID != 2)) {
        pVVar1 = (VmInstruction *)0x0;
      }
      if (pVVar1->cmd == VM_INST_PHI) {
        UncolorAtomicMergeSet(pVVar1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (inst->super_VmValue).users.count);
  }
  return;
}

Assistant:

void UncolorAtomicMergeSet(VmInstruction *inst)
{
	inst->color = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			if(instruction->color != 0)
				UncolorAtomicMergeSet(instruction);
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			UncolorAtomicMergeSet(instruction);
	}
}